

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lice.cc
# Opt level: O2

void __thiscall P8Lice::P8Lice(P8Lice *this)

{
  allocator<char> local_71;
  string local_70;
  string local_50;
  string local_30;
  
  CouchDBInterface::CouchDBInterface(&this->interface);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"p8portal.phys.washington.edu",&local_71);
  CouchDBInterface::setServer(&this->interface,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"5984",&local_71);
  CouchDBInterface::setPort(&this->interface,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"p8slowcontrollog",&local_71);
  CouchDBInterface::setDBName(&this->interface,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

P8Lice::P8Lice() {
	interface.setServer("p8portal.phys.washington.edu");
	interface.setPort("5984");
	interface.setDBName("p8slowcontrollog");
}